

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

NestedTestAllTypes * __thiscall
proto2_unittest::NestedTestAllTypes::operator=(NestedTestAllTypes *this,NestedTestAllTypes *from)

{
  bool bVar1;
  Arena *lhs;
  Arena *rhs;
  NestedTestAllTypes *from_local;
  NestedTestAllTypes *this_local;
  
  if (this != from) {
    lhs = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    rhs = google::protobuf::MessageLite::GetArena((MessageLite *)from);
    bVar1 = google::protobuf::internal::CanMoveWithInternalSwap(lhs,rhs);
    if (bVar1) {
      InternalSwap(this,from);
    }
    else {
      CopyFrom(this,from);
    }
  }
  return this;
}

Assistant:

inline NestedTestAllTypes& operator=(NestedTestAllTypes&& from) noexcept {
    if (this == &from) return *this;
    if (::google::protobuf::internal::CanMoveWithInternalSwap(GetArena(), from.GetArena())) {
      InternalSwap(&from);
    } else {
      CopyFrom(from);
    }
    return *this;
  }